

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O0

Vector2i sf::priv::InputImpl::getMousePosition(void)

{
  int local_3c;
  int local_38;
  int gy;
  int gx;
  uint buttons;
  int y;
  int x;
  Window child;
  Window root;
  Display *display;
  
  root = (Window)OpenDisplay();
  local_38 = 0;
  local_3c = 0;
  XQueryPointer(root,*(undefined8 *)
                      (*(long *)(root + 0xe8) + (long)*(int *)(root + 0xe0) * 0x80 + 0x10),&child,&y
                ,&local_38,&local_3c,&buttons,&gx,&gy);
  CloseDisplay((Display *)root);
  Vector2<int>::Vector2((Vector2<int> *)&display,local_38,local_3c);
  return (Vector2i)display;
}

Assistant:

Vector2i InputImpl::getMousePosition()
{
    // Open a connection with the X server
    Display* display = OpenDisplay();

    // we don't care about these but they are required
    ::Window root, child;
    int x, y;
    unsigned int buttons;

    int gx = 0;
    int gy = 0;
    XQueryPointer(display, DefaultRootWindow(display), &root, &child, &gx, &gy, &x, &y, &buttons);

    // Close the connection with the X server
    CloseDisplay(display);

    return Vector2i(gx, gy);
}